

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O2

REF_STATUS ref_layer_tet_prism(REF_INT *pri_nodes,REF_INT *tet_nodes,REF_BOOL *contains)

{
  REF_STATUS RVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  
  *contains = 0;
  uVar3 = 0;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      uVar3 = uVar3 + (pri_nodes[lVar2] == tet_nodes[lVar4]);
    }
  }
  if ((int)uVar3 < 5) {
    RVar1 = 0;
    if (uVar3 == 4) {
      *contains = 1;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x2e2,
           "ref_layer_tet_prism","repeated tet nodes in prism");
    printf("hits %d\n",(ulong)uVar3);
    RVar1 = 1;
  }
  return RVar1;
}

Assistant:

static REF_FCN REF_STATUS ref_layer_tet_prism(REF_INT *pri_nodes,
                                              REF_INT *tet_nodes,
                                              REF_BOOL *contains) {
  REF_INT hits, tet_node, pri_node;
  *contains = REF_FALSE;
  hits = 0;
  for (pri_node = 0; pri_node < 6; pri_node++) {
    for (tet_node = 0; tet_node < 4; tet_node++) {
      if (pri_nodes[pri_node] == tet_nodes[tet_node]) {
        hits++;
      }
    }
  }
  RAB(hits <= 4, "repeated tet nodes in prism", { printf("hits %d\n", hits); });
  if (4 == hits) *contains = REF_TRUE;
  return REF_SUCCESS;
}